

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O0

SinkFinalizeType __thiscall
duckdb::PhysicalCreateARTIndex::Finalize
          (PhysicalCreateARTIndex *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  CatalogTransaction transaction;
  bool bVar1;
  undefined8 uVar2;
  CatalogException *this_00;
  pointer pCVar3;
  type pCVar4;
  DuckIndexEntry *pDVar5;
  idx_t iVar6;
  DataTableInfo *this_01;
  BoundIndex *in_RCX;
  long in_RDI;
  Catalog *catalog;
  TableIndexList *indexes;
  DuckIndexEntry *index;
  CatalogEntry *index_entry;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  SchemaCatalogEntry *schema;
  DataTable *storage;
  CreateARTIndexGlobalSinkState *state;
  ClientContext *in_stack_fffffffffffffe08;
  CatalogEntry *in_stack_fffffffffffffe10;
  BoundIndex *in_stack_fffffffffffffe30;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index_00;
  BoundIndex *in_stack_fffffffffffffe40;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffe58;
  string *psVar7;
  AlterInfo *in_stack_fffffffffffffe60;
  ClientContext *in_stack_fffffffffffffe68;
  ClientContext *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> local_160;
  string *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  CatalogType type;
  SchemaCatalogEntry *in_stack_fffffffffffffeb8;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffee8;
  optional_ptr<duckdb::CatalogEntry,_true> in_stack_fffffffffffffef0;
  string local_f8 [39];
  undefined1 local_d1 [33];
  ClientContext *local_b0;
  SchemaCatalogEntry *pSStack_a8;
  CatalogEntry *local_88;
  string *local_80;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  DataTable *local_40;
  CreateARTIndexGlobalSinkState *local_38;
  BoundIndex *local_28;
  
  type = (CatalogType)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
  local_28 = in_RCX;
  local_38 = GlobalSinkState::Cast<duckdb::CreateARTIndexGlobalSinkState>
                       ((GlobalSinkState *)in_stack_fffffffffffffe10);
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
            ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *)
             in_stack_fffffffffffffe10);
  BoundIndex::Vacuum(in_stack_fffffffffffffe30);
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
            ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *)
             in_stack_fffffffffffffe10);
  BoundIndex::VerifyAllocations(in_stack_fffffffffffffe30);
  local_40 = (DataTable *)(**(code **)(**(long **)(in_RDI + 0x80) + 0x80))();
  bVar1 = DataTable::IsMainTable((DataTable *)0x18bc0e6);
  if (!bVar1) {
    local_75 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_60,
               "Transaction conflict: cannot add an index to a table that has been altered or dropped"
               ,&local_61);
    TransactionException::TransactionException
              ((TransactionException *)in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08
              );
    local_75 = 0;
    __cxa_throw(uVar2,&TransactionException::typeinfo,TransactionException::~TransactionException);
  }
  local_80 = *(string **)(*(long *)(in_RDI + 0x80) + 0xe0);
  this_00 = (CatalogException *)(in_RDI + 0x88);
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
  operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
              *)in_stack_fffffffffffffe10);
  vector<unsigned_long,_true>::operator=
            ((vector<unsigned_long,_true> *)in_stack_fffffffffffffe10,
             (vector<unsigned_long,_true> *)in_stack_fffffffffffffe08);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>
                      *)0x18bc23c);
  if (bVar1) {
    DataTable::GetDataTableInfo(local_40);
    this_01 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                        ((shared_ptr<duckdb::DataTableInfo,_true> *)in_stack_fffffffffffffe10);
    DataTableInfo::GetIndexes(this_01);
    TableIndexList::
    Scan<duckdb::PhysicalCreateARTIndex::Finalize(duckdb::Pipeline&,duckdb::Event&,duckdb::ClientContext&,duckdb::OperatorSinkFinalizeInput&)const::__0>
              ((TableIndexList *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
    operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                *)in_stack_fffffffffffffe10);
    Catalog::GetCatalog(in_stack_fffffffffffffe70,(string *)in_stack_fffffffffffffe68);
    unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>::operator*
              ((unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
                *)in_stack_fffffffffffffe10);
    Catalog::Alter((Catalog *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                   in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe40 = local_28;
  }
  else {
    psVar7 = local_80;
    SchemaCatalogEntry::GetCatalogTransaction
              ((SchemaCatalogEntry *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
    operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                *)in_stack_fffffffffffffe10);
    transaction.db.ptr._4_4_ = in_stack_fffffffffffffed4;
    transaction.db.ptr._0_4_ = in_stack_fffffffffffffed0;
    transaction.context.ptr._0_4_ = in_stack_fffffffffffffed8;
    transaction.context.ptr._4_4_ = in_stack_fffffffffffffedc;
    transaction.transaction.ptr._0_4_ = in_stack_fffffffffffffee0;
    transaction.transaction.ptr._4_4_ = in_stack_fffffffffffffee4;
    transaction.transaction_id = in_stack_fffffffffffffee8;
    transaction.start_time = (transaction_t)in_stack_fffffffffffffef0.ptr;
    local_88 = (CatalogEntry *)
               SchemaCatalogEntry::GetEntry
                         (in_stack_fffffffffffffeb8,transaction,type,in_stack_fffffffffffffea8);
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_88);
    if (bVar1) {
      pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                             *)pSStack_a8);
      if ((pCVar3->super_CreateInfo).on_conflict == IGNORE_ON_CONFLICT) {
        return READY;
      }
      uVar2 = __cxa_allocate_exception(0x10);
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_d1 + 1),"Index with name \"%s\" already exists!",
                 (allocator *)params);
      pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                             *)pSStack_a8);
      ::std::__cxx11::string::string(local_f8,(string *)&pCVar3->index_name);
      CatalogException::CatalogException<std::__cxx11::string>(this_00,psVar7,params);
      __cxa_throw(uVar2,&CatalogException::typeinfo,CatalogException::~CatalogException);
    }
    psVar7 = local_80;
    SchemaCatalogEntry::GetCatalogTransaction(pSStack_a8,local_b0);
    pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator*((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                          *)pSStack_a8);
    in_stack_fffffffffffffe08 = (ClientContext *)CONCAT44(uStack_134,local_138);
    in_stack_fffffffffffffe10 =
         (CatalogEntry *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
    (**(code **)(*(long *)psVar7 + 0x90))(psVar7,pCVar4,*(undefined8 *)(in_RDI + 0x80));
    optional_ptr<duckdb::CatalogEntry,_true>::get
              ((optional_ptr<duckdb::CatalogEntry,_true> *)&stack0xfffffffffffffef0);
    pDVar5 = CatalogEntry::Cast<duckdb::DuckIndexEntry>(in_stack_fffffffffffffe10);
    unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
              ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *)
               in_stack_fffffffffffffe10);
    iVar6 = BoundIndex::GetInMemorySize(in_stack_fffffffffffffe40);
    pDVar5->initial_index_size = iVar6;
  }
  index_00 = &local_160;
  unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>,true>::
  unique_ptr<duckdb::BoundIndex,std::default_delete<std::unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>>>,void>
            ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
             in_stack_fffffffffffffe10,
             (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_> *)
             in_stack_fffffffffffffe08);
  DataTable::AddIndex((DataTable *)in_stack_fffffffffffffe40,index_00);
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)0x18bc640);
  return READY;
}

Assistant:

SinkFinalizeType PhysicalCreateARTIndex::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                  OperatorSinkFinalizeInput &input) const {
	auto &state = input.global_state.Cast<CreateARTIndexGlobalSinkState>();

	// Vacuum excess memory and verify.
	state.global_index->Vacuum();
	D_ASSERT(!state.global_index->VerifyAndToString(true).empty());
	state.global_index->VerifyAllocations();

	auto &storage = table.GetStorage();
	if (!storage.IsMainTable()) {
		throw TransactionException(
		    "Transaction conflict: cannot add an index to a table that has been altered or dropped");
	}

	auto &schema = table.schema;
	info->column_ids = storage_ids;

	if (!alter_table_info) {
		// Ensure that the index does not yet exist in the catalog.
		auto entry = schema.GetEntry(schema.GetCatalogTransaction(context), CatalogType::INDEX_ENTRY, info->index_name);
		if (entry) {
			if (info->on_conflict != OnCreateConflict::IGNORE_ON_CONFLICT) {
				throw CatalogException("Index with name \"%s\" already exists!", info->index_name);
			}
			// IF NOT EXISTS on existing index. We are done.
			return SinkFinalizeType::READY;
		}

		auto index_entry = schema.CreateIndex(schema.GetCatalogTransaction(context), *info, table).get();
		D_ASSERT(index_entry);
		auto &index = index_entry->Cast<DuckIndexEntry>();
		index.initial_index_size = state.global_index->GetInMemorySize();

	} else {
		// Ensure that there are no other indexes with that name on this table.
		auto &indexes = storage.GetDataTableInfo()->GetIndexes();
		indexes.Scan([&](Index &index) {
			if (index.GetIndexName() == info->index_name) {
				throw CatalogException("an index with that name already exists for this table: %s", info->index_name);
			}
			return false;
		});

		auto &catalog = Catalog::GetCatalog(context, info->catalog);
		catalog.Alter(context, *alter_table_info);
	}

	// Add the index to the storage.
	storage.AddIndex(std::move(state.global_index));
	return SinkFinalizeType::READY;
}